

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O3

set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_> *
dg::pta::getReachableNodes
          (set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
           *__return_storage_ptr__,PSNode *n,PSNode *exit,bool interproc)

{
  _Rb_tree_header *p_Var1;
  PSNode *pPVar2;
  pointer ppPVar3;
  _func_int **pp_Var4;
  undefined7 in_register_00000009;
  _func_int **pp_Var5;
  pointer ppPVar6;
  pair<std::_Rb_tree_iterator<dg::pta::PSNode_*>,_bool> pVar7;
  PSNode *cur;
  PSNode *succ;
  QueueFIFO<dg::pta::PSNode_*> fifo;
  PSNode *local_a0;
  undefined4 local_94;
  PSNode *local_90;
  _Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> local_88;
  PSNode *local_38;
  
  local_94 = (undefined4)CONCAT71(in_register_00000009,interproc);
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_38 = n;
  std::_Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::_M_initialize_map
            (&local_88,0);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>::
    _M_push_back_aux<dg::pta::PSNode*const&>
              ((deque<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>> *)&local_88,&local_38);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = n;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      pPVar2 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      local_a0 = pPVar2;
      pVar7 = std::
              _Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
              ::_M_insert_unique<dg::pta::PSNode*const&>
                        ((_Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
                          *)__return_storage_ptr__,&local_a0);
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        ppPVar3 = (local_a0->super_SubgraphNode<dg::pta::PSNode>)._successors.
                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppPVar6 = (local_a0->super_SubgraphNode<dg::pta::PSNode>)._successors.
                       super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_start; ppPVar6 != ppPVar3;
            ppPVar6 = ppPVar6 + 1) {
          local_90 = *ppPVar6;
          if (local_90 != exit) {
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>::
              _M_push_back_aux<dg::pta::PSNode*const&>
                        ((deque<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>> *)&local_88,
                         &local_90);
            }
            else {
              *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
          }
        }
        if ((char)local_94 != '\0') {
          if (local_a0 == (PSNode *)0x0 || (local_a0->type & ~ALLOC) != CALL) {
            if (local_a0->type == RETURN && local_a0 != (PSNode *)0x0) {
              pp_Var4 = *(_func_int ***)&local_a0[1].super_SubgraphNode<dg::pta::PSNode>;
              for (pp_Var5 = local_a0[1]._vptr_PSNode; pp_Var5 != pp_Var4; pp_Var5 = pp_Var5 + 1) {
                local_90 = (PSNode *)*pp_Var5;
                if (local_90 != exit) {
                  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                    std::deque<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>::
                    _M_push_back_aux<dg::pta::PSNode*const&>
                              ((deque<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>> *)&local_88
                               ,&local_90);
                  }
                  else {
                    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
                    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                  }
                }
              }
            }
          }
          else {
            pp_Var4 = *(_func_int ***)&local_a0[1].super_SubgraphNode<dg::pta::PSNode>;
            for (pp_Var5 = local_a0[1]._vptr_PSNode; pp_Var5 != pp_Var4; pp_Var5 = pp_Var5 + 1) {
              pPVar2 = *(PSNode **)(*pp_Var5 + 0x58);
              if (pPVar2 != exit) {
                if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                  std::deque<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>::
                  _M_push_back_aux<dg::pta::PSNode*const&>
                            ((deque<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>> *)&local_88,
                             (PSNode **)(*pp_Var5 + 0x58));
                }
                else {
                  *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = pPVar2;
                  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                }
              }
            }
          }
        }
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~_Deque_base(&local_88);
  return __return_storage_ptr__;
}

Assistant:

inline std::set<PSNode *> getReachableNodes(PSNode *n, PSNode *exit = nullptr,
                                            bool interproc = true) {
    ADT::QueueFIFO<PSNode *> fifo;
    std::set<PSNode *> cont;

    assert(n && "No starting node given.");
    fifo.push(n);

    while (!fifo.empty()) {
        PSNode *cur = fifo.pop();
        if (!cont.insert(cur).second)
            continue; // we already visited this node

        for (PSNode *succ : cur->successors()) {
            assert(succ != nullptr);

            if (succ == exit)
                continue;

            fifo.push(succ);
        }

        if (interproc) {
            if (PSNodeCall *C = PSNodeCall::get(cur)) {
                for (auto *subg : C->getCallees()) {
                    if (subg->root == exit)
                        continue;
                    fifo.push(subg->root);
                }
            } else if (PSNodeRet *R = PSNodeRet::get(cur)) {
                for (auto *ret : R->getReturnSites()) {
                    if (ret == exit)
                        continue;
                    fifo.push(ret);
                }
            }
        }
    }

    return cont;
}